

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotLineEx<ImPlot::GetterXsYs<int>>(char *label_id,GetterXsYs<int> *getter)

{
  ImVec2 IVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  TransformerLogLog transformer;
  ImPlotPlot *pIVar9;
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  uint uVar13;
  double dVar14;
  double dVar15;
  ImPlotRange *pIVar16;
  int *piVar17;
  int *piVar18;
  bool bVar19;
  uint uVar20;
  ImU32 col;
  long lVar21;
  ImPlotContext *pIVar22;
  int *piVar23;
  int *piVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined8 local_a0;
  ImU32 local_98;
  ImU32 local_94;
  ImDrawList *local_90;
  int *local_88;
  uint local_80;
  uint local_7c;
  undefined8 local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  ulong local_58;
  int *local_50;
  int *local_48;
  undefined8 uStack_40;
  
  bVar19 = BeginItem(label_id,0);
  pIVar22 = GImPlot;
  if (bVar19) {
    if ((GImPlot->FitThisFrame == true) && (iVar2 = getter->Count, 0 < iVar2)) {
      piVar23 = getter->Xs;
      piVar24 = getter->Ys;
      iVar3 = getter->Offset;
      iVar26 = getter->Stride;
      pIVar9 = GImPlot->CurrentPlot;
      iVar4 = pIVar9->CurrentYAxis;
      uVar5 = (pIVar9->XAxis).Flags;
      pIVar16 = GImPlot->ExtentsY;
      uVar6 = pIVar9->YAxis[iVar4].Flags;
      iVar27 = 0;
      uVar25 = uVar6 & 0x20;
      uVar13 = uVar25 >> 5;
      local_48 = (int *)CONCAT44(local_48._4_4_,uVar13);
      piVar18 = local_48;
      local_78 = (ImPlotContext *)(CONCAT44(local_78._4_4_,uVar5) & 0xffffffff00000020);
      uVar20 = (uVar5 & 0x20) >> 5;
      local_88 = (int *)CONCAT44(local_88._4_4_,uVar20);
      piVar17 = local_88;
      do {
        lVar21 = (long)(((iVar3 + iVar27) % iVar2 + iVar2) % iVar2) * (long)iVar26;
        iVar7 = *(int *)((long)piVar23 + lVar21);
        dVar12 = (double)iVar7;
        iVar8 = *(int *)((long)piVar24 + lVar21);
        dVar11 = (double)iVar8;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((0 < iVar7) || ((int)local_78 == 0)) {
LAB_001c8e3b:
            dVar14 = (pIVar22->ExtentsX).Min;
            dVar15 = (pIVar22->ExtentsX).Max;
            uVar28 = -(ulong)(dVar12 < dVar14);
            uVar29 = -(ulong)(dVar15 < dVar12);
            auVar33._0_8_ = (ulong)dVar12 & uVar28;
            auVar33._8_8_ = (ulong)dVar12 & uVar29;
            auVar35._0_8_ = ~uVar28 & (ulong)dVar14;
            auVar35._8_8_ = ~uVar29 & (ulong)dVar15;
            pIVar22->ExtentsX = (ImPlotRange)(auVar35 | auVar33);
          }
        }
        else if (((pIVar9->YAxis[iVar4].Range.Min <= dVar11) &&
                 (dVar11 <= pIVar9->YAxis[iVar4].Range.Max)) &&
                (local_88._0_1_ = (byte)uVar20, (iVar7 < 1 & (byte)local_88) == 0))
        goto LAB_001c8e3b;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((0 < iVar8) || (uVar25 == 0)) {
LAB_001c8ea9:
            dVar12 = pIVar16[iVar4].Min;
            dVar14 = pIVar22->ExtentsY[iVar4].Max;
            uVar29 = -(ulong)(dVar11 < dVar12);
            uVar30 = -(ulong)(dVar14 < dVar11);
            uVar28 = (ulong)dVar11 & uVar30;
            auVar34._0_8_ = ~uVar29 & (ulong)dVar12;
            auVar34._8_8_ = ~uVar30 & (ulong)dVar14;
            auVar10._8_4_ = (int)uVar28;
            auVar10._0_8_ = (ulong)dVar11 & uVar29;
            auVar10._12_4_ = (int)(uVar28 >> 0x20);
            pIVar16[iVar4] = (ImPlotRange)(auVar34 | auVar10);
          }
        }
        else if ((((pIVar9->XAxis).Range.Min <= dVar12) && (dVar12 <= (pIVar9->XAxis).Range.Max)) &&
                (local_48._0_1_ = (byte)uVar13, (iVar8 < 1 & (byte)local_48) == 0))
        goto LAB_001c8ea9;
        iVar27 = iVar27 + 1;
        local_88 = piVar17;
        local_48 = piVar18;
      } while (iVar2 != iVar27);
    }
    local_90 = GetPlotDrawList();
    if ((1 < getter->Count) && ((pIVar22->NextItemData).RenderLine == true)) {
      col = ImGui::GetColorU32((pIVar22->NextItemData).Colors);
      iVar2 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar2]) {
      case 0:
        local_a0 = CONCAT44(local_a0._4_4_,iVar2);
        RenderLineStrip<ImPlot::GetterXsYs<int>,ImPlot::TransformerLinLin>
                  (getter,(TransformerLinLin *)&local_a0,local_90,(pIVar22->NextItemData).LineWeight
                   ,col);
        break;
      case 1:
        local_a0 = CONCAT44(local_a0._4_4_,iVar2);
        RenderLineStrip<ImPlot::GetterXsYs<int>,ImPlot::TransformerLogLin>
                  (getter,(TransformerLogLin *)&local_a0,local_90,(pIVar22->NextItemData).LineWeight
                   ,col);
        break;
      case 2:
        local_a0 = CONCAT44(local_a0._4_4_,iVar2);
        RenderLineStrip<ImPlot::GetterXsYs<int>,ImPlot::TransformerLinLog>
                  (getter,(TransformerLinLog *)&local_a0,local_90,(pIVar22->NextItemData).LineWeight
                   ,col);
        break;
      case 3:
        local_a0 = CONCAT44(local_a0._4_4_,iVar2);
        RenderLineStrip<ImPlot::GetterXsYs<int>,ImPlot::TransformerLogLog>
                  (getter,(TransformerLogLog *)&local_a0,local_90,(pIVar22->NextItemData).LineWeight
                   ,col);
      }
    }
    if ((pIVar22->NextItemData).Marker != -1) {
      PopPlotClipRect();
      PushPlotClipRect((pIVar22->NextItemData).MarkerSize);
      local_94 = ImGui::GetColorU32((pIVar22->NextItemData).Colors + 2);
      local_98 = ImGui::GetColorU32((pIVar22->NextItemData).Colors + 3);
      transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
      local_78 = GImPlot;
      switch(GImPlot->Scales[transformer.YAxis]) {
      case 0:
        iVar2 = getter->Count;
        if (0 < iVar2) {
          piVar23 = getter->Xs;
          piVar24 = getter->Ys;
          uVar28 = (ulong)(uint)getter->Offset;
          local_50 = (int *)CONCAT44(local_50._4_4_,(pIVar22->NextItemData).MarkerSize);
          local_58 = CONCAT44(local_58._4_4_,(pIVar22->NextItemData).MarkerWeight);
          local_60 = (long)(pIVar22->NextItemData).Marker;
          iVar3 = getter->Stride;
          iVar26 = 0;
          bVar19 = (pIVar22->NextItemData).RenderMarkerLine;
          local_70 = CONCAT44(local_70._4_4_,(uint)(pIVar22->NextItemData).RenderMarkerFill);
          pIVar22 = GImPlot;
          local_88 = piVar23;
          local_68 = uVar28;
          local_48 = piVar24;
          do {
            lVar21 = (long)((((int)uVar28 + iVar26) % iVar2 + iVar2) % iVar2) * (long)iVar3;
            IVar1 = pIVar22->PixelRange[transformer.YAxis].Min;
            fVar31 = (float)(pIVar22->Mx *
                             ((double)*(int *)((long)piVar23 + lVar21) -
                             (pIVar22->CurrentPlot->XAxis).Range.Min) + (double)IVar1.x);
            fVar32 = (float)(pIVar22->My[transformer.YAxis] *
                             ((double)*(int *)((long)piVar24 + lVar21) -
                             pIVar22->CurrentPlot->YAxis[transformer.YAxis].Range.Min) +
                            (double)IVar1.y);
            local_a0 = CONCAT44(fVar32,fVar31);
            pIVar9 = local_78->CurrentPlot;
            if ((((pIVar9->PlotRect).Min.x <= fVar31) && ((pIVar9->PlotRect).Min.y <= fVar32)) &&
               ((fVar31 < (pIVar9->PlotRect).Max.x && (fVar32 < (pIVar9->PlotRect).Max.y)))) {
              (**(code **)(RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterXsYs<int>>(ImPlot::GetterXsYs<int>,ImPlot::TransformerLinLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                           ::marker_table + local_60 * 8))
                        (local_50._0_4_,(undefined4)local_58,local_90,&local_a0,bVar19,local_94,
                         local_70 & 0xffffffff,local_98);
              pIVar22 = GImPlot;
              piVar23 = local_88;
              piVar24 = local_48;
              uVar28 = local_68;
            }
            iVar26 = iVar26 + 1;
          } while (iVar2 != iVar26);
        }
        break;
      case 1:
        iVar2 = getter->Count;
        if (0 < iVar2) {
          local_88 = getter->Xs;
          local_50 = getter->Ys;
          local_58 = (ulong)(uint)getter->Offset;
          local_60 = CONCAT44(local_60._4_4_,(pIVar22->NextItemData).MarkerSize);
          local_68 = CONCAT44(local_68._4_4_,(pIVar22->NextItemData).MarkerWeight);
          local_70 = (ulong)(pIVar22->NextItemData).Marker;
          iVar3 = getter->Stride;
          iVar26 = 0;
          local_7c = (uint)(pIVar22->NextItemData).RenderMarkerLine;
          local_80 = (uint)(pIVar22->NextItemData).RenderMarkerFill;
          do {
            pIVar22 = GImPlot;
            lVar21 = (long)((((int)local_58 + iVar26) % iVar2 + iVar2) % iVar2) * (long)iVar3;
            local_48 = (int *)(double)*(int *)((long)local_50 + lVar21);
            uStack_40 = 0;
            dVar11 = log10((double)*(int *)((long)local_88 + lVar21) /
                           (GImPlot->CurrentPlot->XAxis).Range.Min);
            pIVar9 = pIVar22->CurrentPlot;
            dVar12 = (pIVar9->XAxis).Range.Min;
            IVar1 = pIVar22->PixelRange[transformer.YAxis].Min;
            fVar31 = (float)(pIVar22->Mx *
                             (((double)(float)(dVar11 / pIVar22->LogDenX) *
                               ((pIVar9->XAxis).Range.Max - dVar12) + dVar12) - dVar12) +
                            (double)IVar1.x);
            fVar32 = (float)(pIVar22->My[transformer.YAxis] *
                             ((double)local_48 - pIVar9->YAxis[transformer.YAxis].Range.Min) +
                            (double)IVar1.y);
            local_a0 = CONCAT44(fVar32,fVar31);
            pIVar9 = local_78->CurrentPlot;
            if ((((pIVar9->PlotRect).Min.x <= fVar31) && ((pIVar9->PlotRect).Min.y <= fVar32)) &&
               ((fVar31 < (pIVar9->PlotRect).Max.x && (fVar32 < (pIVar9->PlotRect).Max.y)))) {
              (**(code **)(RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterXsYs<int>>(ImPlot::GetterXsYs<int>,ImPlot::TransformerLogLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                           ::marker_table + local_70 * 8))
                        ((undefined4)local_60,(undefined4)local_68,local_90,&local_a0,local_7c,
                         local_94,local_80,local_98);
            }
            iVar26 = iVar26 + 1;
          } while (iVar2 != iVar26);
        }
        break;
      case 2:
        iVar2 = getter->Count;
        if (0 < iVar2) {
          local_88 = getter->Xs;
          local_50 = getter->Ys;
          local_58 = (ulong)(uint)getter->Offset;
          local_60 = CONCAT44(local_60._4_4_,(pIVar22->NextItemData).MarkerSize);
          local_68 = CONCAT44(local_68._4_4_,(pIVar22->NextItemData).MarkerWeight);
          local_70 = (ulong)(pIVar22->NextItemData).Marker;
          iVar3 = getter->Stride;
          iVar26 = 0;
          local_7c = (uint)(pIVar22->NextItemData).RenderMarkerLine;
          local_80 = (uint)(pIVar22->NextItemData).RenderMarkerFill;
          do {
            pIVar22 = GImPlot;
            lVar21 = (long)((((int)local_58 + iVar26) % iVar2 + iVar2) % iVar2) * (long)iVar3;
            local_48 = (int *)(double)*(int *)((long)local_88 + lVar21);
            uStack_40 = 0;
            dVar12 = log10((double)*(int *)((long)local_50 + lVar21) /
                           GImPlot->CurrentPlot->YAxis[transformer.YAxis].Range.Min);
            pIVar9 = pIVar22->CurrentPlot;
            dVar11 = pIVar9->YAxis[transformer.YAxis].Range.Min;
            IVar1 = pIVar22->PixelRange[transformer.YAxis].Min;
            fVar31 = (float)(pIVar22->Mx * ((double)local_48 - (pIVar9->XAxis).Range.Min) +
                            (double)IVar1.x);
            fVar32 = (float)(pIVar22->My[transformer.YAxis] *
                             (((double)(float)(dVar12 / pIVar22->LogDenY[transformer.YAxis]) *
                               (pIVar9->YAxis[transformer.YAxis].Range.Max - dVar11) + dVar11) -
                             dVar11) + (double)IVar1.y);
            local_a0 = CONCAT44(fVar32,fVar31);
            pIVar9 = local_78->CurrentPlot;
            if (((((pIVar9->PlotRect).Min.x <= fVar31) && ((pIVar9->PlotRect).Min.y <= fVar32)) &&
                (fVar31 < (pIVar9->PlotRect).Max.x)) && (fVar32 < (pIVar9->PlotRect).Max.y)) {
              (**(code **)(RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterXsYs<int>>(ImPlot::GetterXsYs<int>,ImPlot::TransformerLinLog,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                           ::marker_table + local_70 * 8))
                        ((undefined4)local_60,(undefined4)local_68,local_90,&local_a0,local_7c,
                         local_94,local_80,local_98);
            }
            iVar26 = iVar26 + 1;
          } while (iVar2 != iVar26);
        }
        break;
      case 3:
        RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterXsYs<int>>
                  (*getter,transformer,local_90,(pIVar22->NextItemData).Marker,
                   (pIVar22->NextItemData).MarkerSize,(pIVar22->NextItemData).RenderMarkerLine,
                   local_94,(pIVar22->NextItemData).MarkerWeight,
                   (pIVar22->NextItemData).RenderMarkerFill,local_98);
      }
    }
    pIVar22 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar22->NextItemData);
    pIVar22->PreviousItem = pIVar22->CurrentItem;
    pIVar22->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotLineEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(p);
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        if (getter.Count > 1 && s.RenderLine) {
            const ImU32 col_line    = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderLineStrip(getter, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderLineStrip(getter, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderLineStrip(getter, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderLineStrip(getter, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        // render markers
        if (s.Marker != ImPlotMarker_None) {
            PopPlotClipRect();
            PushPlotClipRect(s.MarkerSize);
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(getter, TransformerLinLin(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(getter, TransformerLogLin(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(getter, TransformerLinLog(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(getter, TransformerLogLog(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}